

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

Map_Cut_t *
Map_CutMergeLists(Map_Man_t *p,Map_CutTable_t *pTable,Map_Cut_t *pList1,Map_Cut_t *pList2,int fComp1
                 ,int fComp2)

{
  Map_Cut_t **pArray;
  Map_Cut_t *pMVar1;
  int iVar2;
  Map_Cut_t *pMVar3;
  Map_Cut_t *pMVar4;
  int local_110;
  int fComp3;
  int k;
  int nCuts3;
  int nCuts2;
  int nCuts1;
  Map_Cut_t **ppArray3;
  Map_Cut_t **ppArray2;
  Map_Cut_t **ppArray1;
  int local_e0;
  int i;
  int Counter;
  int nNodes;
  Map_Cut_t *pTemp2;
  Map_Cut_t *pTemp1;
  Map_Cut_t *pPrev;
  Map_Cut_t *pCut;
  Map_Cut_t *pLists [7];
  Map_Cut_t *local_78;
  Map_Cut_t **ppListNew;
  Map_Cut_t *pListNew;
  Map_Node_t *ppNodes [6];
  int local_30;
  int local_2c;
  int fComp2_local;
  int fComp1_local;
  Map_Cut_t *pList2_local;
  Map_Cut_t *pList1_local;
  Map_CutTable_t *pTable_local;
  Map_Man_t *p_local;
  
  memset(&pCut,0,0x38);
  ppArray2 = pTable->pCuts1;
  pArray = pTable->pCuts2;
  nCuts3 = Map_CutList2Array(ppArray2,pList1);
  iVar2 = Map_CutList2Array(pArray,pList2);
  k = iVar2;
  ppArray3 = pArray;
  local_30 = fComp2;
  local_2c = fComp1;
  if (iVar2 < nCuts3) {
    k = nCuts3;
    nCuts3 = iVar2;
    ppArray3 = ppArray2;
    ppArray2 = pArray;
    local_30 = fComp1;
    local_2c = fComp2;
  }
  Map_CutTableRestart(pTable);
  local_e0 = 0;
  for (ppArray1._4_4_ = 0; ppArray1._4_4_ < nCuts3; ppArray1._4_4_ = ppArray1._4_4_ + 1) {
    for (local_110 = 0; local_110 <= ppArray1._4_4_; local_110 = local_110 + 1) {
      pMVar4 = ppArray2[ppArray1._4_4_];
      pMVar1 = ppArray3[local_110];
      if (((((int)pMVar4->nLeaves != p->nVarsMax) || ((int)pMVar1->nLeaves != p->nVarsMax)) ||
          ((pMVar4->ppLeaves[0] == pMVar1->ppLeaves[0] &&
           (pMVar4->ppLeaves[1] == pMVar1->ppLeaves[1])))) &&
         ((iVar2 = Map_CutMergeTwo(pMVar4,pMVar1,(Map_Node_t **)&pListNew,p->nVarsMax), iVar2 != 0
          && (pMVar3 = Map_CutTableConsider(p,pTable,(Map_Node_t **)&pListNew,iVar2),
             pMVar3 != (Map_Cut_t *)0x0)))) {
        pMVar3->pOne = (Map_Cut_t *)((ulong)pMVar4 ^ (long)local_2c);
        pMVar3->pTwo = (Map_Cut_t *)((ulong)pMVar1 ^ (long)local_30);
        pMVar3->pNext = pLists[(long)(int)pMVar3->nLeaves + -1];
        pLists[(long)(int)pMVar3->nLeaves + -1] = pMVar3;
        local_e0 = local_e0 + 1;
        if (local_e0 == 1000) goto LAB_00476d78;
      }
    }
    for (local_110 = 0; local_110 < ppArray1._4_4_; local_110 = local_110 + 1) {
      pMVar4 = ppArray2[local_110];
      pMVar1 = ppArray3[ppArray1._4_4_];
      if (((((int)pMVar4->nLeaves != p->nVarsMax) || ((int)pMVar1->nLeaves != p->nVarsMax)) ||
          ((pMVar4->ppLeaves[0] == pMVar1->ppLeaves[0] &&
           (pMVar4->ppLeaves[1] == pMVar1->ppLeaves[1])))) &&
         ((iVar2 = Map_CutMergeTwo(pMVar4,pMVar1,(Map_Node_t **)&pListNew,p->nVarsMax), iVar2 != 0
          && (pMVar3 = Map_CutTableConsider(p,pTable,(Map_Node_t **)&pListNew,iVar2),
             pMVar3 != (Map_Cut_t *)0x0)))) {
        pMVar3->pOne = (Map_Cut_t *)((ulong)pMVar4 ^ (long)local_2c);
        pMVar3->pTwo = (Map_Cut_t *)((ulong)pMVar1 ^ (long)local_30);
        pMVar3->pNext = pLists[(long)(int)pMVar3->nLeaves + -1];
        pLists[(long)(int)pMVar3->nLeaves + -1] = pMVar3;
        local_e0 = local_e0 + 1;
        if (local_e0 == 1000) goto LAB_00476d78;
      }
    }
  }
  for (ppArray1._4_4_ = nCuts3; ppArray1._4_4_ < k; ppArray1._4_4_ = ppArray1._4_4_ + 1) {
    for (local_110 = 0; local_110 < nCuts3; local_110 = local_110 + 1) {
      pMVar4 = ppArray2[local_110];
      pMVar1 = ppArray3[ppArray1._4_4_];
      if (((((int)pMVar4->nLeaves != p->nVarsMax) || ((int)pMVar1->nLeaves != p->nVarsMax)) ||
          ((pMVar4->ppLeaves[0] == pMVar1->ppLeaves[0] &&
           (pMVar4->ppLeaves[1] == pMVar1->ppLeaves[1])))) &&
         ((iVar2 = Map_CutMergeTwo(pMVar4,pMVar1,(Map_Node_t **)&pListNew,p->nVarsMax), iVar2 != 0
          && (pMVar3 = Map_CutTableConsider(p,pTable,(Map_Node_t **)&pListNew,iVar2),
             pMVar3 != (Map_Cut_t *)0x0)))) {
        pMVar3->pOne = (Map_Cut_t *)((ulong)pMVar4 ^ (long)local_2c);
        pMVar3->pTwo = (Map_Cut_t *)((ulong)pMVar1 ^ (long)local_30);
        pMVar3->pNext = pLists[(long)(int)pMVar3->nLeaves + -1];
        pLists[(long)(int)pMVar3->nLeaves + -1] = pMVar3;
        local_e0 = local_e0 + 1;
        if (local_e0 == 1000) goto LAB_00476d78;
      }
    }
  }
LAB_00476d78:
  ppListNew = (Map_Cut_t **)0x0;
  local_78 = (Map_Cut_t *)&ppListNew;
  for (ppArray1._4_4_ = 1; ppArray1._4_4_ <= p->nVarsMax; ppArray1._4_4_ = ppArray1._4_4_ + 1) {
    if (pLists[(long)ppArray1._4_4_ + -1] != (Map_Cut_t *)0x0) {
      pTemp1 = pLists[(long)ppArray1._4_4_ + -1];
      for (pPrev = pTemp1->pNext; pPrev != (Map_Cut_t *)0x0; pPrev = pPrev->pNext) {
        pTemp1 = pPrev;
      }
      local_78->pNext = pLists[(long)ppArray1._4_4_ + -1];
      local_78 = pTemp1;
    }
  }
  local_78->pNext = (Map_Cut_t *)0x0;
  pMVar4 = Map_CutSortCuts(p,pTable,(Map_Cut_t *)ppListNew);
  return pMVar4;
}

Assistant:

Map_Cut_t * Map_CutMergeLists( Map_Man_t * p, Map_CutTable_t * pTable, 
    Map_Cut_t * pList1, Map_Cut_t * pList2, int fComp1, int fComp2 )
{
    Map_Node_t * ppNodes[6];
    Map_Cut_t * pListNew, ** ppListNew, * pLists[7] = { NULL };
    Map_Cut_t * pCut, * pPrev, * pTemp1, * pTemp2;
    int nNodes, Counter, i;
    Map_Cut_t ** ppArray1, ** ppArray2, ** ppArray3;
    int nCuts1, nCuts2, nCuts3, k, fComp3;

    ppArray1 = pTable->pCuts1;
    ppArray2 = pTable->pCuts2;
    nCuts1 = Map_CutList2Array( ppArray1, pList1 );
    nCuts2 = Map_CutList2Array( ppArray2, pList2 );
    // swap the lists based on their length
    if ( nCuts1 > nCuts2 )
    {
         ppArray3 = ppArray1;
         ppArray1 = ppArray2;
         ppArray2 = ppArray3;

         nCuts3 = nCuts1;
         nCuts1 = nCuts2;
         nCuts2 = nCuts3;

         fComp3 = fComp1;
         fComp1 = fComp2;
         fComp2 = fComp3;
    }
    // pList1 is shorter or equal length compared to pList2
 
    // prepare the manager for the cut computation
    Map_CutTableRestart( pTable );
    // go through the cut pairs
    Counter = 0;
//    for ( pTemp1 = pList1; pTemp1; pTemp1 = fPivot1? NULL: pTemp1->pNext )
//        for ( pTemp2 = pList2; pTemp2; pTemp2 = fPivot2? NULL: pTemp2->pNext )
    for ( i = 0; i < nCuts1; i++ )
    {
        for ( k = 0; k <= i; k++ )
        {
            pTemp1 = ppArray1[i];
            pTemp2 = ppArray2[k];

            if ( pTemp1->nLeaves == p->nVarsMax && pTemp2->nLeaves == p->nVarsMax )
            {
                if ( pTemp1->ppLeaves[0] != pTemp2->ppLeaves[0] )
                    continue;
                if ( pTemp1->ppLeaves[1] != pTemp2->ppLeaves[1] )
                    continue;
            }

            // check if k-feasible cut exists
            nNodes = Map_CutMergeTwo( pTemp1, pTemp2, ppNodes, p->nVarsMax );
            if ( nNodes == 0 )
                continue;
            // consider the cut for possible addition to the set of new cuts
            pCut = Map_CutTableConsider( p, pTable, ppNodes, nNodes );
            if ( pCut == NULL )
                continue;
            // add data to the cut
            pCut->pOne = Map_CutNotCond( pTemp1, fComp1 );
            pCut->pTwo = Map_CutNotCond( pTemp2, fComp2 );
//            if ( p->nVarsMax == 5 )
//            pCut->uTruth = Map_CutComputeTruth( p, pCut, pTemp1, pTemp2, fComp1, fComp2 );
            // add it to the corresponding list
            pCut->pNext = pLists[(int)pCut->nLeaves];
            pLists[(int)pCut->nLeaves] = pCut;
            // count this cut and quit if limit is reached
            Counter++;
            if ( Counter == MAP_CUTS_MAX_COMPUTE )
                goto QUITS;
        }
        for ( k = 0; k < i; k++ )
        {
            pTemp1 = ppArray1[k];
            pTemp2 = ppArray2[i];

            if ( pTemp1->nLeaves == p->nVarsMax && pTemp2->nLeaves == p->nVarsMax )
            {
                if ( pTemp1->ppLeaves[0] != pTemp2->ppLeaves[0] )
                    continue;
                if ( pTemp1->ppLeaves[1] != pTemp2->ppLeaves[1] )
                    continue;
            }

            // check if k-feasible cut exists
            nNodes = Map_CutMergeTwo( pTemp1, pTemp2, ppNodes, p->nVarsMax );
            if ( nNodes == 0 )
                continue;
            // consider the cut for possible addition to the set of new cuts
            pCut = Map_CutTableConsider( p, pTable, ppNodes, nNodes );
            if ( pCut == NULL )
                continue;
            // add data to the cut
            pCut->pOne = Map_CutNotCond( pTemp1, fComp1 );
            pCut->pTwo = Map_CutNotCond( pTemp2, fComp2 );
//            if ( p->nVarsMax == 5 )
//            pCut->uTruth = Map_CutComputeTruth( p, pCut, pTemp1, pTemp2, fComp1, fComp2 );
            // add it to the corresponding list
            pCut->pNext = pLists[(int)pCut->nLeaves];
            pLists[(int)pCut->nLeaves] = pCut;
            // count this cut and quit if limit is reached
            Counter++;
            if ( Counter == MAP_CUTS_MAX_COMPUTE )
                goto QUITS;
        }
    }
    // consider the rest of them
    for ( i = nCuts1; i < nCuts2; i++ )
        for ( k = 0; k < nCuts1; k++ )
        {
            pTemp1 = ppArray1[k];
            pTemp2 = ppArray2[i];

            if ( pTemp1->nLeaves == p->nVarsMax && pTemp2->nLeaves == p->nVarsMax )
            {
                if ( pTemp1->ppLeaves[0] != pTemp2->ppLeaves[0] )
                    continue;
                if ( pTemp1->ppLeaves[1] != pTemp2->ppLeaves[1] )
                    continue;
            }

            // check if k-feasible cut exists
            nNodes = Map_CutMergeTwo( pTemp1, pTemp2, ppNodes, p->nVarsMax );
            if ( nNodes == 0 )
                continue;
            // consider the cut for possible addition to the set of new cuts
            pCut = Map_CutTableConsider( p, pTable, ppNodes, nNodes );
            if ( pCut == NULL )
                continue;
            // add data to the cut
            pCut->pOne = Map_CutNotCond( pTemp1, fComp1 );
            pCut->pTwo = Map_CutNotCond( pTemp2, fComp2 );
//            if ( p->nVarsMax == 5 )
//            pCut->uTruth = Map_CutComputeTruth( p, pCut, pTemp1, pTemp2, fComp1, fComp2 );
            // add it to the corresponding list
            pCut->pNext = pLists[(int)pCut->nLeaves];
            pLists[(int)pCut->nLeaves] = pCut;
            // count this cut and quit if limit is reached
            Counter++;
            if ( Counter == MAP_CUTS_MAX_COMPUTE )
                goto QUITS;
        }
QUITS :
    // combine all the lists into one
    pListNew  = NULL;
    ppListNew = &pListNew;
    for ( i = 1; i <= p->nVarsMax; i++ )
    {
        if ( pLists[i] == NULL )
            continue;
        // find the last entry
        for ( pPrev = pLists[i], pCut = pPrev->pNext; pCut; 
            pPrev = pCut, pCut = pCut->pNext );
        // connect these lists
        *ppListNew = pLists[i];
        ppListNew  = &pPrev->pNext;
    }
    *ppListNew = NULL;
    // soft the cuts by arrival times and use only the first MAP_CUTS_MAX_USE
    pListNew = Map_CutSortCuts( p, pTable, pListNew );
    return pListNew;
}